

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O3

void D_AddConfigWads(TArray<FString,_FString> *wadfiles,char *section)

{
  bool bVar1;
  int iVar2;
  char *value;
  char *key;
  Position pos;
  FString local_60;
  char *local_58;
  char *local_50;
  TArray<FString,_FString> *local_48;
  Position local_40;
  
  local_48 = wadfiles;
  bVar1 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,section,false);
  if (bVar1) {
    bVar1 = FConfigFile::NextInSection(&GameConfig->super_FConfigFile,&local_50,&local_58);
    if (bVar1) {
      do {
        iVar2 = strcasecmp(local_50,"Path");
        if (iVar2 == 0) {
          FConfigFile::GetPosition(&GameConfig->super_FConfigFile,&local_40);
          ExpandEnvVars((char *)&local_60);
          D_AddWildFile(local_48,local_60.Chars);
          FString::~FString(&local_60);
          FConfigFile::SetPosition(&GameConfig->super_FConfigFile,&local_40);
        }
        bVar1 = FConfigFile::NextInSection(&GameConfig->super_FConfigFile,&local_50,&local_58);
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void D_AddConfigWads (TArray<FString> &wadfiles, const char *section)
{
	if (GameConfig->SetSection (section))
	{
		const char *key;
		const char *value;
		FConfigFile::Position pos;

		while (GameConfig->NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0)
			{
				// D_AddWildFile resets GameConfig's position, so remember it
				GameConfig->GetPosition (pos);
				D_AddWildFile (wadfiles, ExpandEnvVars(value));
				// Reset GameConfig's position to get next wad
				GameConfig->SetPosition (pos);
			}
		}
	}
}